

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O1

void __thiscall HydEngine::~HydEngine(HydEngine *this)

{
  pointer pcVar1;
  int in_ESI;
  
  close(this,in_ESI);
  pcVar1 = (this->timeStepReason)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->timeStepReason).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

HydEngine::~HydEngine()
{
    close();

//    cout << "\nHydEngine destructed.\n";
}